

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O1

void TPZShapeHCurl<pzshape::TPZShapeQuad>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZShapeData *data)

{
  ulong uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  ulong uVar6;
  int i;
  long lVar7;
  TPZFNMatrix<9,_double> gradX;
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  if (connectorders->fNElements != 5) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurl.cpp"
               ,0x19);
  }
  CalcH1ShapeOrders(connectorders,&(data->fH1ConnectOrders).super_TPZVec<int>);
  TPZShapeH1<pzshape::TPZShapeQuad>::Initialize
            (ids,&(data->fH1ConnectOrders).super_TPZVec<int>,data);
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)
       ((ulong)local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
               _vptr_TPZSavable._4_4_ << 0x20);
  TPZManVector<int,_20>::Resize(&data->fSideTransformationId,5,(int *)&local_110);
  lVar7 = 0;
  do {
    iVar3 = pztopology::TPZQuadrilateral::GetTransformId((int)lVar7 + 4,ids);
    (data->fSideTransformationId).super_TPZVec<int>.fStore[lVar7] = iVar3;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix._26_6_ = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZManVector_01840098;
  uVar1 = connectorders->fNElements;
  if ((long)uVar1 < 0x1c) {
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (int64_t)&local_110.fElem;
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ = 0;
  }
  else {
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
         (int64_t)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ = uVar1;
  }
  if (0 < (long)uVar1) {
    piVar2 = connectorders->fStore;
    uVar6 = 0;
    do {
      *(int *)(local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + uVar6 * 4) =
           piVar2[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar1;
  TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,(TPZManVector<int,_27> *)&local_110);
  if ((double **)local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow == &local_110.fElem) {
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  }
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix._26_6_ = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZVec_0183b5b0;
  if ((double **)local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != (double **)0x0) {
    operator_delete__((void *)local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow);
  }
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,5);
  lVar7 = 0;
  iVar3 = 0;
  do {
    iVar4 = ComputeNConnectShapeF((int)lVar7,connectorders->fStore[lVar7]);
    (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[lVar7] = iVar4;
    iVar3 = iVar3 + iVar4;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar3);
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ =
       local_110.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ & 0xffffffffffff0000;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::operator=(&local_110,0.0);
  TPZMatrix<double>::Identity(&local_110.super_TPZMatrix<double>);
  if ((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix
      .fCol * (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fRow != 0x36) {
    pdVar5 = (data->fMasterDirections).super_TPZFMatrix<double>.fElem;
    if ((pdVar5 != (double *)0x0) &&
       (pdVar5 != (data->fMasterDirections).super_TPZFMatrix<double>.fGiven)) {
      operator_delete__(pdVar5);
    }
    pdVar5 = (data->fMasterDirections).super_TPZFMatrix<double>.fGiven;
    if ((pdVar5 == (double *)0x0) ||
       ((data->fMasterDirections).super_TPZFMatrix<double>.fSize < 0x36)) {
      pdVar5 = (double *)operator_new__(0x1b0);
    }
    (data->fMasterDirections).super_TPZFMatrix<double>.fElem = pdVar5;
  }
  (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fRow = 2;
  (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fCol = 0x1b;
  (*(data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0xf])(&data->fMasterDirections);
  pztopology::TPZQuadrilateral::ComputeHCurlDirections<double>
            (&local_110,&(data->fMasterDirections).super_TPZFMatrix<double>,
             &(data->fSideTransformationId).super_TPZVec<int>);
  ComputeVecandShape(data);
  TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_0183dba8);
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                       TPZVec<int> &connectorders,
                                       TPZShapeData &data)
{
    
        
    constexpr int ncon = TSHAPE::NSides-TSHAPE::NCornerNodes;
    constexpr int NCorners = TSHAPE::NCornerNodes;
    constexpr int NSides = TSHAPE::NSides;
    if(connectorders.size() != ncon) DebugStop();
    CalcH1ShapeOrders(connectorders, data.fH1ConnectOrders);
    TPZShapeH1<TSHAPE>::Initialize(ids, data.fH1ConnectOrders, data);
    data.fSideTransformationId.Resize(NSides-NCorners, 0);
    for (int iside = NCorners; iside< NSides ; iside++) {
        int pos = iside - NCorners;
        int trans_id = TSHAPE::GetTransformId(iside, ids); // Foi criado
        data.fSideTransformationId[iside-NCorners] = trans_id;
    }

    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(ncon);
    int nShape = 0;
    for (int i = 0; i < ncon; i++)
    {
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,connectorders[i]);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);
    TPZFNMatrix<9,REAL> gradX(TSHAPE::Dimension, TSHAPE::Dimension, 0);
    gradX.Identity();

    data.fMasterDirections.Redim(TSHAPE::Dimension, 3*NSides);
    TSHAPE::ComputeHCurlDirections(gradX,data.fMasterDirections,data.fSideTransformationId);

    ComputeVecandShape(data);
}